

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O1

ProgressInfo __thiscall Quest_Context::Progress(Quest_Context *this)

{
  string *__lhs;
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Character *this_00;
  pointer pcVar3;
  _Map_pointer ppvVar4;
  _Map_pointer ppvVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Rule *pRVar9;
  undefined8 *puVar10;
  size_type sVar11;
  ulong uVar12;
  _Elt_pointer pvVar13;
  variant *pvVar14;
  const_iterator cVar15;
  undefined8 uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string goal_progress_key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  key_type local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pRVar9 = EOPlus::Context::GetGoal(&this->super_Context);
  uVar16 = 5;
  if (pRVar9 == (Rule *)0x0) {
LAB_0018b1e6:
    uVar8 = 0;
  }
  else {
    __lhs = &(pRVar9->expr).function;
    iVar6 = std::__cxx11::string::compare((char *)__lhs);
    if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)__lhs), iVar6 == 0)) {
      pvVar13 = (pRVar9->expr).args.super__Deque_base<util::variant,_std::allocator<util::variant>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = ((long)pvVar13 -
                (long)(pRVar9->expr).args.
                      super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                      super__Deque_impl_data._M_start._M_first >> 6) + 1;
      if (uVar12 < 8) {
        pvVar14 = pvVar13 + 1;
      }
      else {
        pvVar14 = (pRVar9->expr).args.
                  super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar12 >> 3] + uVar12 + (uVar12 >> 3) * -8
        ;
      }
      uVar7 = util::variant::GetInt(pvVar14);
      pvVar13 = (pRVar9->expr).args.super__Deque_base<util::variant,_std::allocator<util::variant>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = (long)pvVar13 -
               (long)(pRVar9->expr).args.
                     super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                     super__Deque_impl_data._M_start._M_first >> 6;
      if (7 < uVar12) {
        pvVar13 = (pRVar9->expr).args.
                  super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[uVar12 >> 3] + uVar12 + (uVar12 >> 3) * -8
        ;
      }
      this_00 = this->character;
      iVar6 = util::variant::GetInt(pvVar13);
      uVar8 = Character::HasItem(this_00,(short)iVar6,false);
      if ((int)uVar8 < (int)uVar7) {
        uVar7 = uVar8;
      }
      ppvVar4 = (pRVar9->expr).args.super__Deque_base<util::variant,_std::allocator<util::variant>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ppvVar5 = (pRVar9->expr).args.super__Deque_base<util::variant,_std::allocator<util::variant>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      pvVar13 = (pRVar9->expr).args.super__Deque_base<util::variant,_std::allocator<util::variant>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar8 = 1;
      if (1 < ((long)(pRVar9->expr).args.
                     super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                     super__Deque_impl_data._M_start._M_last - (long)pvVar13 >> 6) +
              ((long)(pRVar9->expr).args.
                     super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur -
               (long)(pRVar9->expr).args.
                     super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first >> 6) +
              ((long)ppvVar4 + ((ulong)(ppvVar4 != (_Map_pointer)0x0) * -8 - (long)ppvVar5) &
              0xfffffffffffffff8)) {
        uVar12 = ((long)pvVar13 -
                  (long)(pRVar9->expr).args.
                        super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 6) + 1;
        if (uVar12 < 8) {
          pvVar14 = pvVar13 + 1;
        }
        else {
          pvVar14 = ppvVar5[uVar12 >> 3] + uVar12 + (uVar12 >> 3) * -8;
        }
        uVar8 = util::variant::GetInt(pvVar14);
      }
      uVar16 = 3;
      goto LAB_0018b70a;
    }
    iVar6 = std::__cxx11::string::compare((char *)__lhs);
    if ((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare((char *)__lhs), iVar6 != 0)) {
      iVar6 = std::__cxx11::string::compare((char *)__lhs);
      if (iVar6 == 0) {
        std::operator+(&local_b0,__lhs,"/");
        pvVar13 = (pRVar9->expr).args.
                  super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        uVar12 = (long)pvVar13 -
                 (long)(pRVar9->expr).args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_first >> 6;
        if (7 < uVar12) {
          pvVar13 = (_Elt_pointer)
                    ((ulong)(((uint)uVar12 & 7) << 6) +
                    *(long *)((long)(pRVar9->expr).args.
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node +
                             (uVar12 & 0xfffffffffffffff8)));
        }
        util::variant::GetString_abi_cxx11_(&local_90,pvVar13);
        std::operator+(&local_70,&local_b0,&local_90);
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        sVar11 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                           (&(pRVar9->expr).args);
        uVar8 = 1;
        if (1 < sVar11) {
          pvVar13 = (pRVar9->expr).args.
                    super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
          uVar12 = ((long)pvVar13 -
                    (long)(pRVar9->expr).args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6) + 1;
          if (uVar12 < 8) {
            pvVar14 = pvVar13 + 1;
          }
          else {
            pvVar14 = (variant *)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(pRVar9->expr).args.
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          uVar8 = util::variant::GetInt(pvVar14);
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)__lhs);
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare((char *)__lhs);
          if ((((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)__lhs), iVar6 == 0))
              || (iVar6 = std::__cxx11::string::compare((char *)__lhs), iVar6 == 0)) ||
             (iVar6 = std::__cxx11::string::compare((char *)__lhs), iVar6 == 0)) {
            uVar16 = 10;
          }
          goto LAB_0018b1e6;
        }
        std::__cxx11::string::_M_assign((string *)&local_50);
        pvVar13 = (pRVar9->expr).args.
                  super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        uVar12 = (long)pvVar13 -
                 (long)(pRVar9->expr).args.
                       super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                       super__Deque_impl_data._M_start._M_first >> 6;
        if (7 < uVar12) {
          pvVar13 = (_Elt_pointer)
                    ((ulong)(((uint)uVar12 & 7) << 6) +
                    *(long *)((long)(pRVar9->expr).args.
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node +
                             (uVar12 & 0xfffffffffffffff8)));
        }
        uVar8 = util::variant::GetInt(pvVar13);
      }
      uVar16 = 8;
      goto LAB_0018b707;
    }
    paVar2 = &local_b0.field_2;
    pcVar3 = (pRVar9->expr).function._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,pcVar3 + (pRVar9->expr).function._M_string_length);
    std::__cxx11::string::append((char *)&local_b0);
    pvVar13 = (pRVar9->expr).args.super__Deque_base<util::variant,_std::allocator<util::variant>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar12 = (long)pvVar13 -
             (long)(pRVar9->expr).args.
                   super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first >> 6;
    if (7 < uVar12) {
      pvVar13 = (_Elt_pointer)
                ((ulong)(((uint)uVar12 & 7) << 6) +
                *(long *)((long)(pRVar9->expr).args.
                                super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_node +
                         (uVar12 & 0xfffffffffffffff8)));
    }
    util::variant::GetString_abi_cxx11_(&local_90,pvVar13);
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      uVar16 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_90._M_string_length + local_b0._M_string_length) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar16 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_90._M_string_length + local_b0._M_string_length) goto LAB_0018b3f3;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_0018b3f3:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    psVar1 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_70.field_2._M_allocated_capacity = *psVar1;
      local_70.field_2._8_8_ = puVar10[3];
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar1;
      local_70._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_70._M_string_length = puVar10[1];
    *puVar10 = psVar1;
    puVar10[1] = 0;
    *(undefined1 *)psVar1 = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    ppvVar4 = (pRVar9->expr).args.super__Deque_base<util::variant,_std::allocator<util::variant>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    ppvVar5 = (pRVar9->expr).args.super__Deque_base<util::variant,_std::allocator<util::variant>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    pvVar13 = (pRVar9->expr).args.super__Deque_base<util::variant,_std::allocator<util::variant>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar8 = 1;
    if (1 < ((long)(pRVar9->expr).args.
                   super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                   super__Deque_impl_data._M_start._M_last - (long)pvVar13 >> 6) +
            ((long)(pRVar9->expr).args.
                   super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur -
             (long)(pRVar9->expr).args.
                   super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first >> 6) +
            ((long)ppvVar4 + ((ulong)(ppvVar4 != (_Map_pointer)0x0) * -8 - (long)ppvVar5) &
            0xfffffffffffffff8)) {
      uVar12 = ((long)pvVar13 -
                (long)(pRVar9->expr).args.
                      super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                      super__Deque_impl_data._M_start._M_first >> 6) + 1;
      if (uVar12 < 8) {
        pvVar14 = pvVar13 + 1;
      }
      else {
        pvVar14 = (variant *)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)ppvVar5 + (uVar12 & 0xfffffffffffffff8)));
      }
      uVar8 = util::variant::GetInt(pvVar14);
    }
    uVar16 = 3;
  }
LAB_0018b707:
  uVar7 = 0;
LAB_0018b70a:
  if ((local_50._M_string_length != 0) &&
     (cVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::find(&(this->progress)._M_t,&local_50),
     (_Rb_tree_header *)cVar15._M_node != &(this->progress)._M_t._M_impl.super__Rb_tree_header)) {
    uVar7 = (uint)(ushort)(short)cVar15._M_node[2]._M_color;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return (ProgressInfo)((uint6)uVar16 | (uint6)(uVar7 << 0x10) | (uint6)(uVar8 & 0xffff) << 0x20);
}

Assistant:

Quest_Context::ProgressInfo Quest_Context::Progress() const
{
	BookIcon icon = BOOK_ICON_TALK;
	std::string goal_progress_key;
	short goal_progress = 0;
	short goal_goal = 0;

	const EOPlus::Rule* goal = this->GetGoal();

	if (goal)
	{
		if (goal->expr.function == "gotitems" || goal->expr.function == "gotspell")
		{
			icon = BOOK_ICON_ITEM;
			goal_progress = std::min<int>(goal->expr.args[1], this->character->HasItem(int(goal->expr.args[0])));
			goal_goal = goal->expr.args.size() >= 2 ? int(goal->expr.args[1]) : 1;
		}
		else if (goal->expr.function == "useditem" || goal->expr.function == "usedspell")
		{
			icon = BOOK_ICON_ITEM;
			goal_progress_key = goal->expr.function + "/" + std::string(goal->expr.args[0]);
			goal_goal = goal->expr.args.size() >= 2 ? int(goal->expr.args[1]) : 1;
		}
		else if (goal->expr.function == "killednpcs")
		{
			icon = BOOK_ICON_KILL;
			goal_progress_key = goal->expr.function + "/" + std::string(goal->expr.args[0]);
			goal_goal = goal->expr.args.size() >= 2 ? int(goal->expr.args[1]) : 1;
		}
		else if (goal->expr.function == "killedplayers")
		{
			icon = BOOK_ICON_KILL;
			goal_progress_key = goal->expr.function;
			goal_goal = int(goal->expr.args[0]);
		}
		else if (goal->expr.function == "entercoord" || goal->expr.function == "leavecoord" || goal->expr.function == "entermap" || goal->expr.function == "leavemap")
		{
			icon = BOOK_ICON_STEP;
		}
	}

	if (!goal_progress_key.empty())
	{
		auto it = this->progress.find(goal_progress_key);

		if (it != this->progress.end())
			goal_progress = it->second;
	}

	return ProgressInfo{icon, goal_progress, goal_goal};
}